

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esni.c
# Opt level: O2

void usage(char *cmd,int status)

{
  printf("picotls-esni - generates an ESNI Resource Record\n\nUsage: %s [options]\nOptions:\n  -K <key-file>       private key files (repeat the option to include multiple\n                      keys)\n  -c <cipher-suite>   aes128-gcm, chacha20-poly1305, ...\n  -d <days>           number of days until expiration (default: 90)\n  -p <padded-length>  padded length (default: 260)\n  -h                  prints this help\n\n-c and -x can be used multiple times.\n\n"
         ,cmd);
  exit(status);
}

Assistant:

static void usage(const char *cmd, int status)
{
    printf("picotls-esni - generates an ESNI Resource Record\n"
           "\n"
           "Usage: %s [options]\n"
           "Options:\n"
           "  -K <key-file>       private key files (repeat the option to include multiple\n"
           "                      keys)\n"
           "  -c <cipher-suite>   aes128-gcm, chacha20-poly1305, ...\n"
           "  -d <days>           number of days until expiration (default: 90)\n"
           "  -p <padded-length>  padded length (default: 260)\n"
           "  -h                  prints this help\n"
           "\n"
           "-c and -x can be used multiple times.\n"
           "\n",
           cmd);
    exit(status);
}